

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryMkdir(DiskHandle *this,PathPtr path,WriteMode mode,bool noThrow)

{
  size_t sVar1;
  int iVar2;
  __mode_t __mode;
  char *pcVar3;
  bool bVar4;
  PathPtr PVar5;
  String filename;
  stat stats;
  String local_e8;
  PathPtr local_d0;
  stat local_c0;
  
  local_d0.parts.size_ = path.parts.size_;
  local_d0.parts.ptr = path.parts.ptr;
  PathPtr::toString(&local_e8,&local_d0,false);
  __mode = 0x1c0;
  if ((mode & PRIVATE) == 0) {
    __mode = 0x1ff;
  }
  do {
    pcVar3 = "";
    if (local_e8.content.size_ != 0) {
      pcVar3 = local_e8.content.ptr;
    }
    iVar2 = mkdirat((this->fd).fd,pcVar3,__mode);
    bVar4 = true;
    if (-1 < iVar2) goto LAB_004a3544;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) goto LAB_004a3544;
  if (iVar2 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (local_d0.parts.size_ != 0)) {
      PVar5 = PathPtr::parent(&local_d0);
      bVar4 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar4) {
        PVar5.parts.size_ = local_d0.parts.size_;
        PVar5.parts.ptr = local_d0.parts.ptr;
        bVar4 = tryMkdir(this,PVar5,mode & ~CREATE_PARENT,noThrow);
        goto LAB_004a3544;
      }
    }
LAB_004a353a:
    if (!noThrow) {
LAB_004a359f:
      kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x35b,iVar2,"mkdirat(fd, path)","path",&local_d0);
      kj::_::Debug::Fault::fatal((Fault *)&local_c0);
    }
  }
  else {
    if (iVar2 != 0x11) goto LAB_004a353a;
    if ((mode & MODIFY) != 0) {
      do {
        pcVar3 = "";
        if (local_e8.content.size_ != 0) {
          pcVar3 = local_e8.content.ptr;
        }
        iVar2 = fstatat((this->fd).fd,pcVar3,&local_c0,0);
        if (-1 < iVar2) {
          bVar4 = (local_c0.st_mode & 0xf000) == 0x4000;
          goto LAB_004a3544;
        }
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (noThrow || iVar2 == 0) {
        bVar4 = iVar2 == 0 && (local_c0.st_mode & 0xf000) == 0x4000;
        goto LAB_004a3544;
      }
      iVar2 = 0x11;
      goto LAB_004a359f;
    }
  }
  bVar4 = false;
LAB_004a3544:
  sVar1 = local_e8.content.size_;
  pcVar3 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar3,1,sVar1,sVar1,0);
  }
  return bVar4;
}

Assistant:

bool tryMkdir(PathPtr path, WriteMode mode, bool noThrow) const {
    // Internal function to make a directory.

    auto filename = path.toString();
    mode_t acl = has(mode, WriteMode::PRIVATE) ? 0700 : 0777;

    KJ_SYSCALL_HANDLE_ERRORS(mkdirat(fd, filename.cStr(), acl)) {
      case EEXIST: {
        // Apparently this path exists.
        if (!has(mode, WriteMode::MODIFY)) {
          // Require exclusive create.
          return false;
        }

        // MODIFY is allowed, so we just need to check whether the existing entry is a directory.
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, filename.cStr(), &stats, 0)) {
          default:
            // mkdir() says EEXIST but we can't stat it. Maybe it's a dangling link, or maybe
            // we can't access it for some reason. Assume failure.
            //
            // TODO(someday): Maybe we should be creating the directory at the target of the
            //   link?
            goto failed;
        }
        return (stats.st_mode & S_IFMT) == S_IFDIR;
      }
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
            tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                    WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          return tryMkdir(path, mode - WriteMode::CREATE_PARENT, noThrow);
        } else {
          goto failed;
        }
      default:
      failed:
        if (noThrow) {
          // Caller requested no throwing.
          return false;
        } else {
          KJ_FAIL_SYSCALL("mkdirat(fd, path)", error, path);
        }
    }

    return true;
  }